

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O3

void __thiscall TRM::TGAImage::clearColor(TGAImage *this,TGAColor *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar3 = this->width;
  if (iVar3 != 0) {
    iVar1 = this->height;
    uVar7 = 0;
    iVar2 = iVar1;
    do {
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        uVar5 = 0;
        do {
          uVar4 = (uint)uVar5;
          uVar6 = (uint)uVar7;
          if ((-1 < (int)(uVar4 | uVar6) && this->data != (uchar *)0x0) &&
             ((int)uVar4 < iVar2 && (int)uVar6 < this->width)) {
            memcpy(this->data + (long)(int)(this->width * uVar4 + uVar6) * (long)this->bytespp,c,
                   (long)this->bytespp);
            iVar1 = this->height;
          }
          uVar5 = uVar5 + 1;
          iVar2 = iVar1;
        } while (uVar5 < (ulong)(long)iVar1);
        iVar3 = this->width;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(long)iVar3);
  }
  return;
}

Assistant:

void TGAImage::clearColor(const TGAColor &c) {
  for (size_t i = 0; i < width; i++) {
    for (size_t j = 0; j < height; j++) {
      set(i, j, c);
    }
  }
}